

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStore.cpp
# Opt level: O3

MessageStore * __thiscall FIX::NullStoreFactory::create(NullStoreFactory *this,SessionID *param_1)

{
  MessageStore *pMVar1;
  _func_int **local_20;
  _func_int **pp_Stack_18;
  
  pMVar1 = (MessageStore *)operator_new(0x28);
  pMVar1->_vptr_MessageStore = (_func_int **)&PTR__NullStore_001eb898;
  pMVar1[1]._vptr_MessageStore = (_func_int **)0x100000001;
  DateTime::nowUtc();
  pMVar1[3]._vptr_MessageStore = local_20;
  pMVar1[4]._vptr_MessageStore = pp_Stack_18;
  pMVar1[2]._vptr_MessageStore = (_func_int **)&PTR__DateTime_001ea8f0;
  return pMVar1;
}

Assistant:

MessageStore* NullStoreFactory::create( const SessionID& )
{
  return new NullStore();
}